

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O1

UniValue * __thiscall
GetinfoRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,GetinfoRequestHandler *this,UniValue *batch_in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string key_13;
  string key_14;
  string key_15;
  string key_16;
  string key_17;
  string key_18;
  UniValue result_00;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  UniValue val_14;
  UniValue val_15;
  UniValue val_16;
  UniValue val_17;
  UniValue val_18;
  UniValue error;
  optional<UniValue> id;
  UniValue *pUVar5;
  GetinfoRequestHandler *pGVar6;
  GetinfoRequestHandler *pGVar7;
  long in_FS_OFFSET;
  vector<UniValue,_std::allocator<UniValue>_> batch;
  UniValue connections;
  UniValue result;
  GetinfoRequestHandler *pGVar8;
  pointer in_stack_fffffffffffff3f0;
  pointer pUVar9;
  pointer pUVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff3f8;
  undefined1 auVar11 [32];
  undefined1 in_stack_fffffffffffff408 [56];
  undefined1 in_stack_fffffffffffff440 [32];
  bool bVar12;
  undefined7 in_stack_fffffffffffff461;
  VType VVar13;
  undefined4 in_stack_fffffffffffff46c;
  undefined1 *puVar14;
  undefined8 in_stack_fffffffffffff478;
  long in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff488 [16];
  undefined1 in_stack_fffffffffffff498 [40];
  VType VVar15;
  undefined4 in_stack_fffffffffffff4c4;
  _Alloc_hider _Var16;
  size_type sVar17;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffff4e0;
  pointer pbVar19;
  pointer pbVar20;
  vector<UniValue,_std::allocator<UniValue>_> local_b00;
  VType local_ae8;
  long *local_ae0 [2];
  long local_ad0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ac0;
  vector<UniValue,_std::allocator<UniValue>_> local_aa8;
  long *local_a90 [2];
  long local_a80 [2];
  VType local_a70;
  long *local_a68 [2];
  long local_a58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a48;
  vector<UniValue,_std::allocator<UniValue>_> local_a30;
  long *local_a18 [2];
  long local_a08 [2];
  string local_9f8;
  VType local_9d8;
  long *local_9d0 [2];
  long local_9c0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b0;
  vector<UniValue,_std::allocator<UniValue>_> local_998;
  long *local_980 [2];
  long local_970 [2];
  VType local_960;
  long *local_958 [2];
  long local_948 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_938;
  vector<UniValue,_std::allocator<UniValue>_> local_920;
  long *local_908 [2];
  long local_8f8 [2];
  VType local_8e8;
  long *local_8e0 [2];
  long local_8d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c0;
  vector<UniValue,_std::allocator<UniValue>_> local_8a8;
  long *local_890 [2];
  long local_880 [2];
  VType local_870;
  long *local_868 [2];
  long local_858 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_848;
  vector<UniValue,_std::allocator<UniValue>_> local_830;
  long *local_818 [2];
  long local_808 [2];
  VType local_7f8;
  long *local_7f0 [2];
  long local_7e0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d0;
  vector<UniValue,_std::allocator<UniValue>_> local_7b8;
  long *local_7a0 [2];
  long local_790 [2];
  UniValue local_780;
  long *local_728 [2];
  long local_718 [2];
  VType local_708;
  long *local_700 [2];
  long local_6f0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e0;
  vector<UniValue,_std::allocator<UniValue>_> local_6c8;
  long *local_6b0 [2];
  long local_6a0 [2];
  VType local_690;
  long *local_688 [2];
  long local_678 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668;
  vector<UniValue,_std::allocator<UniValue>_> local_650;
  long *local_638 [2];
  long local_628 [2];
  VType local_618;
  long *local_610 [2];
  long local_600 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  vector<UniValue,_std::allocator<UniValue>_> local_5d8;
  long *local_5c0 [2];
  long local_5b0 [2];
  VType local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_598;
  size_type local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  vector<UniValue,_std::allocator<UniValue>_> local_560;
  long *local_548 [2];
  long local_538 [2];
  VType local_528;
  long *local_520 [2];
  long local_510 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_500;
  vector<UniValue,_std::allocator<UniValue>_> local_4e8;
  long *local_4d0 [2];
  long local_4c0 [2];
  VType local_4b0;
  long *local_4a8 [2];
  long local_498 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  vector<UniValue,_std::allocator<UniValue>_> local_470;
  long *local_458 [2];
  long local_448 [2];
  string local_438;
  VType local_418;
  long *local_410 [2];
  long local_400 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f0;
  vector<UniValue,_std::allocator<UniValue>_> local_3d8;
  long *local_3c0 [2];
  long local_3b0 [2];
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390 [9];
  undefined4 local_387;
  undefined2 local_383;
  char local_381;
  undefined1 local_380 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<UniValue,_std::allocator<UniValue>_> vStack_340;
  VType local_328;
  long *local_320 [2];
  long local_310 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  vector<UniValue,_std::allocator<UniValue>_> local_2e8;
  long *local_2d0 [2];
  long local_2c0 [2];
  VType local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<UniValue,_std::allocator<UniValue>_> local_270;
  long *local_258 [2];
  long local_248 [2];
  VType local_238;
  long *local_230 [2];
  long local_220 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<UniValue,_std::allocator<UniValue>_> local_1f8;
  long *local_1e0 [2];
  long local_1d0 [2];
  VType local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<UniValue,_std::allocator<UniValue>_> local_180;
  long *local_168 [2];
  long local_158 [2];
  string local_148;
  VType local_128;
  long *local_120 [2];
  long local_110 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<UniValue,_std::allocator<UniValue>_> local_e8;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val.field_2._9_4_ = local_97;
  local_90.val.field_2._13_2_ = local_93;
  local_90.val.field_2._M_local_buf[0xf] = local_91;
  local_90.val._M_string_length = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  JSONRPCProcessBatchReply
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffff3f0,batch_in);
  iVar2 = this->ID_NETWORKINFO;
  pcVar3 = local_380 + 0x10;
  pUVar9 = in_stack_fffffffffffff3f0;
  local_380._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"error","");
  pUVar5 = UniValue::operator[](in_stack_fffffffffffff3f0 + iVar2,(string *)local_380);
  VVar13 = pUVar5->typ;
  if ((pointer)local_380._0_8_ != pcVar3) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  if (VVar13 == VNULL) {
    iVar2 = this->ID_BLOCKCHAININFO;
    pUVar10 = pUVar9;
    local_380._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"error","");
    pUVar5 = UniValue::operator[](pUVar9 + iVar2,(string *)local_380);
    VVar13 = pUVar5->typ;
    if ((pointer)local_380._0_8_ != pcVar3) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if (VVar13 == VNULL) {
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"version","");
      iVar2 = this->ID_NETWORKINFO;
      pUVar9 = pUVar10;
      local_380._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,(string *)local_380);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"version","");
      pUVar5 = UniValue::operator[](pUVar5,&local_148);
      local_128 = pUVar5->typ;
      pcVar4 = (pUVar5->val)._M_dataplus._M_p;
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar4,pcVar4 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_100,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_e8,&pUVar5->values);
      key._M_string_length = (size_type)pUVar9;
      key._M_dataplus._M_p = (pointer)this;
      key.field_2 = in_stack_fffffffffffff3f8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val.typ = in_stack_fffffffffffff408._0_4_;
      val._4_4_ = in_stack_fffffffffffff408._4_4_;
      val.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val.val._M_string_length = auVar11._8_8_;
      val.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_380._0_8_ != pcVar3) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"blocks","");
      iVar2 = this->ID_BLOCKCHAININFO;
      pUVar10 = pUVar9;
      local_380._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,(string *)local_380);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"blocks","");
      pUVar5 = UniValue::operator[](pUVar5,&local_148);
      local_1c0 = pUVar5->typ;
      pcVar4 = (pUVar5->val)._M_dataplus._M_p;
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,pcVar4,pcVar4 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_198,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_180,&pUVar5->values);
      key_00._M_string_length = (size_type)pUVar10;
      key_00._M_dataplus._M_p = (pointer)this;
      key_00.field_2 = in_stack_fffffffffffff3f8;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_00.typ = in_stack_fffffffffffff408._0_4_;
      val_00._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_00.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_00.val._M_string_length = auVar11._8_8_;
      val_00.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_00,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_380._0_8_ != pcVar3) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      local_1e0[0] = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"headers","");
      iVar2 = this->ID_BLOCKCHAININFO;
      pUVar9 = pUVar10;
      local_380._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,(string *)local_380);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"headers","");
      pUVar5 = UniValue::operator[](pUVar5,&local_148);
      local_238 = pUVar5->typ;
      pcVar4 = (pUVar5->val)._M_dataplus._M_p;
      local_230[0] = local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,pcVar4,pcVar4 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_210,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_1f8,&pUVar5->values);
      key_01._M_string_length = (size_type)pUVar9;
      key_01._M_dataplus._M_p = (pointer)this;
      key_01.field_2 = in_stack_fffffffffffff3f8;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_01.typ = in_stack_fffffffffffff408._0_4_;
      val_01._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_01.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_01.val._M_string_length = auVar11._8_8_;
      val_01.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_01,val_01);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_380._0_8_ != pcVar3) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"verificationprogress","")
      ;
      iVar2 = this->ID_BLOCKCHAININFO;
      pUVar10 = pUVar9;
      local_380._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,(string *)local_380);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"verificationprogress","");
      pUVar5 = UniValue::operator[](pUVar5,&local_148);
      local_2b0 = pUVar5->typ;
      pcVar4 = (pUVar5->val)._M_dataplus._M_p;
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a8,pcVar4,pcVar4 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_288,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_270,&pUVar5->values);
      key_02._M_string_length = (size_type)pUVar10;
      key_02._M_dataplus._M_p = (pointer)this;
      key_02.field_2 = in_stack_fffffffffffff3f8;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_02.typ = in_stack_fffffffffffff408._0_4_;
      val_02._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_02.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_02.val._M_string_length = auVar11._8_8_;
      val_02.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_02,val_02);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_288);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0],local_298[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_380._0_8_ != pcVar3) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      local_2d0[0] = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"timeoffset","");
      iVar2 = this->ID_NETWORKINFO;
      pUVar9 = pUVar10;
      local_380._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,(string *)local_380);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"timeoffset","");
      pUVar5 = UniValue::operator[](pUVar5,&local_148);
      local_328 = pUVar5->typ;
      pcVar4 = (pUVar5->val)._M_dataplus._M_p;
      local_320[0] = local_310;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_320,pcVar4,pcVar4 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_300,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_2e8,&pUVar5->values);
      key_03._M_string_length = (size_type)pUVar9;
      key_03._M_dataplus._M_p = (pointer)this;
      key_03.field_2 = in_stack_fffffffffffff3f8;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_03.typ = in_stack_fffffffffffff408._0_4_;
      val_03._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_03.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_03.val._M_string_length = auVar11._8_8_;
      val_03.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_03,val_03);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_300);
      if (local_320[0] != local_310) {
        operator_delete(local_320[0],local_310[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_380._0_8_ != pcVar3) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      pGVar8 = this;
      if (local_2d0[0] != local_2c0) {
        operator_delete(local_2d0[0],local_2c0[0] + 1);
      }
      local_3a0 = local_390;
      local_398 = 0;
      local_380._8_8_ = &local_368;
      local_380._0_4_ = 1;
      local_368._M_local_buf[0] = '\0';
      local_368._1_7_ = (undefined7)local_390._1_8_;
      local_368._M_local_buf[8] = SUB81(local_390._1_8_,7);
      local_368._9_4_ = local_387;
      local_368._13_2_ = local_383;
      local_368._M_local_buf[0xf] = local_381;
      local_380._16_8_ = 0;
      local_390[0] = 0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c0[0] = local_3b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"in","");
      iVar2 = this->ID_NETWORKINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar10 = pUVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"connections_in","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_418 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_410[0] = local_400;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_410,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3f0,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_3d8,&pUVar5->values);
      key_04._M_string_length = (size_type)pUVar10;
      key_04._M_dataplus._M_p = (pointer)pGVar8;
      key_04.field_2 = in_stack_fffffffffffff3f8;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_04.typ = in_stack_fffffffffffff408._0_4_;
      val_04._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_04.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_04.val._M_string_length = auVar11._8_8_;
      val_04.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV((UniValue *)local_380,key_04,val_04);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3f0);
      if (local_410[0] != local_400) {
        operator_delete(local_410[0],local_400[0] + 1);
      }
      pGVar7 = pGVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_3c0[0] != local_3b0) {
        operator_delete(local_3c0[0],local_3b0[0] + 1);
      }
      local_458[0] = local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"out","");
      iVar2 = pGVar8->ID_NETWORKINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar9 = pUVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"connections_out","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_4b0 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_4a8[0] = local_498;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4a8,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_488,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_470,&pUVar5->values);
      key_05._M_string_length = (size_type)pUVar9;
      key_05._M_dataplus._M_p = (pointer)pGVar7;
      key_05.field_2 = in_stack_fffffffffffff3f8;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_05.typ = in_stack_fffffffffffff408._0_4_;
      val_05._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_05.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_05.val._M_string_length = auVar11._8_8_;
      val_05.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV((UniValue *)local_380,key_05,val_05);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_470);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_488);
      if (local_4a8[0] != local_498) {
        operator_delete(local_4a8[0],local_498[0] + 1);
      }
      pGVar8 = pGVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_458[0] != local_448) {
        operator_delete(local_458[0],local_448[0] + 1);
      }
      local_4d0[0] = local_4c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"total","");
      iVar2 = pGVar7->ID_NETWORKINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar10 = pUVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"connections","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_528 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_520[0] = local_510;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_500,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_4e8,&pUVar5->values);
      key_06._M_string_length = (size_type)pUVar10;
      key_06._M_dataplus._M_p = (pointer)pGVar8;
      key_06.field_2 = in_stack_fffffffffffff3f8;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_06.typ = in_stack_fffffffffffff408._0_4_;
      val_06._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_06.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_06.val._M_string_length = auVar11._8_8_;
      val_06.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV((UniValue *)local_380,key_06,val_06);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_500);
      if (local_520[0] != local_510) {
        operator_delete(local_520[0],local_510[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_4d0[0] != local_4c0) {
        operator_delete(local_4d0[0],local_4c0[0] + 1);
      }
      local_548[0] = local_538;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"connections","");
      local_5a0 = local_380._0_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._8_8_ == &local_368) {
        local_588._8_8_ =
             CONCAT17(local_368._M_local_buf[0xf],
                      CONCAT25(local_368._13_2_,CONCAT41(local_368._9_4_,local_368._M_local_buf[8]))
                     );
        local_598 = &local_588;
      }
      else {
        local_598 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._8_8_;
      }
      local_588._M_allocated_capacity._1_7_ = local_368._1_7_;
      local_588._M_local_buf[0] = local_368._M_local_buf[0];
      local_590 = local_380._16_8_;
      local_380._16_8_ = 0;
      local_368._M_local_buf[0] = '\0';
      local_578.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_358.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_578.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_358.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_578.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_358.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_560.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_560.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_560.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_340.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key_07._M_string_length = (size_type)pUVar10;
      key_07._M_dataplus._M_p = (pointer)pGVar8;
      key_07.field_2 = in_stack_fffffffffffff3f8;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_07.typ = in_stack_fffffffffffff408._0_4_;
      val_07._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_07.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_07.val._M_string_length = auVar11._8_8_;
      val_07.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      local_380._8_8_ = &local_368;
      UniValue::pushKV(&local_90,key_07,val_07);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_560);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_578);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588._M_allocated_capacity + 1);
      }
      pGVar7 = pGVar8;
      if (local_548[0] != local_538) {
        operator_delete(local_548[0],local_538[0] + 1);
      }
      local_5c0[0] = local_5b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"networks","");
      iVar2 = pGVar8->ID_NETWORKINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar9 = pUVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"networks","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_618 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_610[0] = local_600;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_610,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_5f0,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_5d8,&pUVar5->values);
      key_08._M_string_length = (size_type)pUVar9;
      key_08._M_dataplus._M_p = (pointer)pGVar7;
      key_08.field_2 = in_stack_fffffffffffff3f8;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_08.typ = in_stack_fffffffffffff408._0_4_;
      val_08._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_08.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_08.val._M_string_length = auVar11._8_8_;
      val_08.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_08,val_08);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5f0);
      if (local_610[0] != local_600) {
        operator_delete(local_610[0],local_600[0] + 1);
      }
      pGVar8 = pGVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_5c0[0] != local_5b0) {
        operator_delete(local_5c0[0],local_5b0[0] + 1);
      }
      local_638[0] = local_628;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"difficulty","");
      iVar2 = pGVar7->ID_BLOCKCHAININFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar10 = pUVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"difficulty","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_690 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_688[0] = local_678;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_688,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_668,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_650,&pUVar5->values);
      key_09._M_string_length = (size_type)pUVar10;
      key_09._M_dataplus._M_p = (pointer)pGVar8;
      key_09.field_2 = in_stack_fffffffffffff3f8;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_09.typ = in_stack_fffffffffffff408._0_4_;
      val_09._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_09.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_09.val._M_string_length = auVar11._8_8_;
      val_09.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_09,val_09);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_650);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_668);
      if (local_688[0] != local_678) {
        operator_delete(local_688[0],local_678[0] + 1);
      }
      pGVar7 = pGVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_638[0] != local_628) {
        operator_delete(local_638[0],local_628[0] + 1);
      }
      local_6b0[0] = local_6a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"chain","");
      iVar2 = pGVar8->ID_BLOCKCHAININFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar9 = pUVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"chain","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_708 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_700[0] = local_6f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_700,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_6e0,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_6c8,&pUVar5->values);
      key_10._M_string_length = (size_type)pUVar9;
      key_10._M_dataplus._M_p = (pointer)pGVar7;
      key_10.field_2 = in_stack_fffffffffffff3f8;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_10.typ = in_stack_fffffffffffff408._0_4_;
      val_10._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_10.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_10.val._M_string_length = auVar11._8_8_;
      val_10.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_10,val_10);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_6e0);
      if (local_700[0] != local_6f0) {
        operator_delete(local_700[0],local_6f0[0] + 1);
      }
      pGVar8 = pGVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_6b0[0] != local_6a0) {
        operator_delete(local_6b0[0],local_6a0[0] + 1);
      }
      iVar2 = pGVar7->ID_WALLETINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar10 = pUVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
      VVar13 = pUVar5->typ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (VVar13 != VNULL) {
        local_728[0] = local_718;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"has_wallet","");
        local_148._M_dataplus._M_p._0_1_ = 1;
        UniValue::UniValue<bool,_bool,_true>(&local_780,(bool *)&local_148);
        key_11._M_string_length = (size_type)pUVar10;
        key_11._M_dataplus._M_p = (pointer)pGVar8;
        key_11.field_2 = in_stack_fffffffffffff3f8;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        auVar11 = in_stack_fffffffffffff408._8_32_;
        val_11.typ = in_stack_fffffffffffff408._0_4_;
        val_11._4_4_ = in_stack_fffffffffffff408._4_4_;
        val_11.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
        val_11.val._M_string_length = auVar11._8_8_;
        val_11.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar11._16_16_;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
        UniValue::pushKV(&local_90,key_11,val_11);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_780.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_780.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780.val._M_dataplus._M_p != &local_780.val.field_2) {
          operator_delete(local_780.val._M_dataplus._M_p,
                          local_780.val.field_2._M_allocated_capacity + 1);
        }
        if (local_728[0] != local_718) {
          operator_delete(local_728[0],local_718[0] + 1);
        }
        local_7a0[0] = local_790;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"keypoolsize","");
        iVar2 = pGVar7->ID_WALLETINFO;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pUVar9 = pUVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
        pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"keypoolsize","");
        pUVar5 = UniValue::operator[](pUVar5,&local_438);
        local_7f8 = pUVar5->typ;
        pcVar3 = (pUVar5->val)._M_dataplus._M_p;
        local_7f0[0] = local_7e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_7f0,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_7d0,&pUVar5->keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_7b8,&pUVar5->values);
        key_12._M_string_length = (size_type)pUVar9;
        key_12._M_dataplus._M_p = (pointer)pGVar8;
        key_12.field_2 = in_stack_fffffffffffff3f8;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        auVar11 = in_stack_fffffffffffff408._8_32_;
        val_12.typ = in_stack_fffffffffffff408._0_4_;
        val_12._4_4_ = in_stack_fffffffffffff408._4_4_;
        val_12.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
        val_12.val._M_string_length = auVar11._8_8_;
        val_12.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar11._16_16_;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
        UniValue::pushKV(&local_90,key_12,val_12);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_7b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_7d0);
        if (local_7f0[0] != local_7e0) {
          operator_delete(local_7f0[0],local_7e0[0] + 1);
        }
        pGVar6 = pGVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_7a0[0] != local_790) {
          operator_delete(local_7a0[0],local_790[0] + 1);
        }
        local_818[0] = local_808;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"walletname","");
        iVar2 = pGVar8->ID_WALLETINFO;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pUVar10 = pUVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
        pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"walletname","");
        pUVar5 = UniValue::operator[](pUVar5,&local_438);
        local_870 = pUVar5->typ;
        pcVar3 = (pUVar5->val)._M_dataplus._M_p;
        local_868[0] = local_858;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_868,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_848,&pUVar5->keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_830,&pUVar5->values);
        key_13._M_string_length = (size_type)pUVar10;
        key_13._M_dataplus._M_p = (pointer)pGVar6;
        key_13.field_2 = in_stack_fffffffffffff3f8;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        auVar11 = in_stack_fffffffffffff408._8_32_;
        val_13.typ = in_stack_fffffffffffff408._0_4_;
        val_13._4_4_ = in_stack_fffffffffffff408._4_4_;
        val_13.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
        val_13.val._M_string_length = auVar11._8_8_;
        val_13.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar11._16_16_;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
        UniValue::pushKV(&local_90,key_13,val_13);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_830);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_848);
        if (local_868[0] != local_858) {
          operator_delete(local_868[0],local_858[0] + 1);
        }
        pGVar7 = pGVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_818[0] != local_808) {
          operator_delete(local_818[0],local_808[0] + 1);
        }
        iVar2 = pGVar6->ID_WALLETINFO;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pUVar9 = pUVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
        pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"unlocked_until","");
        pUVar5 = UniValue::operator[](pUVar5,&local_438);
        VVar13 = pUVar5->typ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (VVar13 != VNULL) {
          local_890[0] = local_880;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"unlocked_until","");
          iVar2 = pGVar6->ID_WALLETINFO;
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          pUVar10 = pUVar9;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
          pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"unlocked_until","");
          pUVar5 = UniValue::operator[](pUVar5,&local_438);
          local_8e8 = pUVar5->typ;
          pcVar3 = (pUVar5->val)._M_dataplus._M_p;
          local_8e0[0] = local_8d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_8e0,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_8c0,&pUVar5->keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_8a8,&pUVar5->values);
          key_14._M_string_length = (size_type)pUVar10;
          key_14._M_dataplus._M_p = (pointer)pGVar7;
          key_14.field_2 = in_stack_fffffffffffff3f8;
          val_14.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)in_stack_fffffffffffff440._0_8_;
          val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data =
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
          auVar11 = in_stack_fffffffffffff408._8_32_;
          val_14.typ = in_stack_fffffffffffff408._0_4_;
          val_14._4_4_ = in_stack_fffffffffffff408._4_4_;
          val_14.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
          val_14.val._M_string_length = auVar11._8_8_;
          val_14.val.field_2 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )auVar11._16_16_;
          val_14.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
          val_14.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
          UniValue::pushKV(&local_90,key_14,val_14);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_8a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_8c0);
          pGVar6 = pGVar7;
          pUVar9 = pUVar10;
          if (local_8e0[0] != local_8d0) {
            operator_delete(local_8e0[0],local_8d0[0] + 1);
            pGVar6 = pGVar7;
            pUVar9 = pUVar10;
          }
          pGVar7 = pGVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if (local_890[0] != local_880) {
            operator_delete(local_890[0],local_880[0] + 1);
          }
        }
        local_908[0] = local_8f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"paytxfee","");
        iVar2 = pGVar6->ID_WALLETINFO;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pUVar10 = pUVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
        pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"paytxfee","");
        pUVar5 = UniValue::operator[](pUVar5,&local_438);
        local_960 = pUVar5->typ;
        pcVar3 = (pUVar5->val)._M_dataplus._M_p;
        local_958[0] = local_948;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_958,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_938,&pUVar5->keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_920,&pUVar5->values);
        key_15._M_string_length = (size_type)pUVar10;
        key_15._M_dataplus._M_p = (pointer)pGVar7;
        key_15.field_2 = in_stack_fffffffffffff3f8;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        auVar11 = in_stack_fffffffffffff408._8_32_;
        val_15.typ = in_stack_fffffffffffff408._0_4_;
        val_15._4_4_ = in_stack_fffffffffffff408._4_4_;
        val_15.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
        val_15.val._M_string_length = auVar11._8_8_;
        val_15.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar11._16_16_;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
        UniValue::pushKV(&local_90,key_15,val_15);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_920);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_938);
        if (local_958[0] != local_948) {
          operator_delete(local_958[0],local_948[0] + 1);
        }
        pGVar8 = pGVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_908[0] != local_8f8) {
          operator_delete(local_908[0],local_8f8[0] + 1);
        }
      }
      iVar2 = pGVar7->ID_BALANCES;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar9 = pUVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
      VVar13 = pUVar5->typ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (VVar13 != VNULL) {
        local_980[0] = local_970;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"balance","");
        iVar2 = pGVar7->ID_BALANCES;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pUVar10 = pUVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
        pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"mine","");
        pUVar5 = UniValue::operator[](pUVar5,&local_438);
        local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"trusted","");
        pUVar5 = UniValue::operator[](pUVar5,&local_9f8);
        local_9d8 = pUVar5->typ;
        pcVar3 = (pUVar5->val)._M_dataplus._M_p;
        local_9d0[0] = local_9c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_9d0,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_9b0,&pUVar5->keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_998,&pUVar5->values);
        key_16._M_string_length = (size_type)pUVar10;
        key_16._M_dataplus._M_p = (pointer)pGVar8;
        key_16.field_2 = in_stack_fffffffffffff3f8;
        val_16.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        auVar11 = in_stack_fffffffffffff408._8_32_;
        val_16.typ = in_stack_fffffffffffff408._0_4_;
        val_16._4_4_ = in_stack_fffffffffffff408._4_4_;
        val_16.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
        val_16.val._M_string_length = auVar11._8_8_;
        val_16.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar11._16_16_;
        val_16.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
        val_16.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
        UniValue::pushKV(&local_90,key_16,val_16);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_998);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_9b0);
        pGVar7 = pGVar8;
        pUVar9 = pUVar10;
        if (local_9d0[0] != local_9c0) {
          operator_delete(local_9d0[0],local_9c0[0] + 1);
          pGVar7 = pGVar8;
          pUVar9 = pUVar10;
        }
        pGVar8 = pGVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
          operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_980[0] != local_970) {
          operator_delete(local_980[0],local_970[0] + 1);
        }
      }
      local_a18[0] = local_a08;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"relayfee","");
      iVar2 = pGVar7->ID_NETWORKINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar10 = pUVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar9 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"relayfee","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_a70 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_a68[0] = local_a58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a68,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a48,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_a30,&pUVar5->values);
      key_17._M_string_length = (size_type)pUVar10;
      key_17._M_dataplus._M_p = (pointer)pGVar8;
      key_17.field_2 = in_stack_fffffffffffff3f8;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_17.typ = in_stack_fffffffffffff408._0_4_;
      val_17._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_17.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_17.val._M_string_length = auVar11._8_8_;
      val_17.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_17,val_17);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a48);
      if (local_a68[0] != local_a58) {
        operator_delete(local_a68[0],local_a58[0] + 1);
      }
      pGVar7 = pGVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_a18[0] != local_a08) {
        operator_delete(local_a18[0],local_a08[0] + 1);
      }
      local_a90[0] = local_a80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a90,"warnings","");
      iVar2 = pGVar8->ID_NETWORKINFO;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pUVar9 = pUVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
      pUVar5 = UniValue::operator[](pUVar10 + iVar2,&local_148);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"warnings","");
      pUVar5 = UniValue::operator[](pUVar5,&local_438);
      local_ae8 = pUVar5->typ;
      pcVar3 = (pUVar5->val)._M_dataplus._M_p;
      local_ae0[0] = local_ad0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_ae0,pcVar3,pcVar3 + (pUVar5->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_ac0,&pUVar5->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_aa8,&pUVar5->values);
      key_18._M_string_length = (size_type)pUVar9;
      key_18._M_dataplus._M_p = (pointer)pGVar7;
      key_18.field_2 = in_stack_fffffffffffff3f8;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_18.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      auVar11 = in_stack_fffffffffffff408._8_32_;
      val_18.typ = in_stack_fffffffffffff408._0_4_;
      val_18._4_4_ = in_stack_fffffffffffff408._4_4_;
      val_18.val._M_dataplus._M_p = (pointer)auVar11._0_8_;
      val_18.val._M_string_length = auVar11._8_8_;
      val_18.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff408._40_8_;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff408._48_8_;
      UniValue::pushKV(&local_90,key_18,val_18);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_aa8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_ac0);
      if (local_ae0[0] != local_ad0) {
        operator_delete(local_ae0[0],local_ad0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_a90[0] != local_a80) {
        operator_delete(local_a90[0],local_a80[0] + 1);
      }
      pbVar20 = local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar19 = local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar17 = local_90.val._M_string_length;
      paVar1 = &local_90.val.field_2;
      _Var16._M_p = local_90.val._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.val._M_dataplus._M_p == paVar1) {
        in_stack_fffffffffffff4e0 =
             CONCAT17(local_90.val.field_2._M_local_buf[0xf],
                      CONCAT25(local_90.val.field_2._13_2_,
                               CONCAT41(local_90.val.field_2._9_4_,
                                        local_90.val.field_2._M_local_buf[8])));
        _Var16._M_p = (pointer)&stack0xfffffffffffff4d8;
      }
      uVar18._1_7_ = local_90.val.field_2._M_allocated_capacity._1_7_;
      uVar18._0_1_ = local_90.val.field_2._M_local_buf[0];
      local_90.val._M_string_length = 0;
      local_90.val.field_2._M_local_buf[0] = '\0';
      local_90.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b00.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
      local_b00.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ =
           local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
      local_b00.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish._0_4_;
      local_b00.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
      local_b00.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      VVar13 = NullUniValue.typ;
      puVar14 = &stack0xfffffffffffff480;
      VVar15 = local_90.typ;
      local_90.val._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffff470,NullUniValue.val._M_dataplus._M_p,
                 NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xfffffffffffff490,&NullUniValue.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffff4a8,
                 &NullUniValue.values);
      local_148._M_dataplus._M_p._0_4_ = 1;
      UniValue::UniValue<int,_int,_true>((UniValue *)&stack0xfffffffffffff408,(int *)&local_148);
      bVar12 = true;
      result_00.val._M_dataplus._M_p = (pointer)pUVar9;
      result_00._0_8_ = pGVar7;
      result_00.val._8_16_ = in_stack_fffffffffffff3f8;
      result_00._32_56_ = in_stack_fffffffffffff408;
      error.val.field_2._M_local_buf[8] = 1;
      error._0_32_ = in_stack_fffffffffffff440;
      error.val.field_2._9_7_ = in_stack_fffffffffffff461;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = VVar13;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff46c;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar14;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff478;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff480;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff488._0_8_;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff488._8_8_;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._40_4_ = VVar15;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._0_40_ = in_stack_fffffffffffff498;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._44_4_ = in_stack_fffffffffffff4c4;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var16._M_p;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar17;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uVar18;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff4e0;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pbVar19;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _88_8_ = pbVar20;
      JSONRPCReplyObj(__return_storage_ptr__,result_00,error,id,
                      (JSONRPCVersion)&stack0xfffffffffffff4c0);
      if (bVar12 == true) {
        std::_Optional_payload_base<UniValue>::_M_destroy
                  ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffff408);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffff4a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff490);
      if (puVar14 != &stack0xfffffffffffff480) {
        operator_delete(puVar14,in_stack_fffffffffffff480 + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff4e8);
      if (_Var16._M_p != &stack0xfffffffffffff4d8) {
        operator_delete(_Var16._M_p,uVar18 + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_340);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._8_8_ != &local_368) {
        operator_delete((void *)local_380._8_8_,
                        CONCAT71(local_368._1_7_,local_368._M_local_buf[0]) + 1);
      }
    }
    else {
      iVar2 = this->ID_BLOCKCHAININFO;
      __return_storage_ptr__->typ = pUVar10[iVar2].typ;
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      pcVar3 = pUVar10[iVar2].val._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->val,pcVar3,
                 pcVar3 + pUVar10[iVar2].val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->keys,&pUVar10[iVar2].keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector
                (&__return_storage_ptr__->values,&pUVar10[iVar2].values);
    }
  }
  else {
    iVar2 = this->ID_NETWORKINFO;
    __return_storage_ptr__->typ = pUVar9[iVar2].typ;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    pcVar3 = pUVar9[iVar2].val._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->val,pcVar3,
               pcVar3 + pUVar9[iVar2].val._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->keys,&pUVar9[iVar2].keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              (&__return_storage_ptr__->values,&pUVar9[iVar2].values);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffff3f0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

UniValue ProcessReply(const UniValue &batch_in) override
    {
        UniValue result(UniValue::VOBJ);
        const std::vector<UniValue> batch = JSONRPCProcessBatchReply(batch_in);
        // Errors in getnetworkinfo() and getblockchaininfo() are fatal, pass them on;
        // getwalletinfo() and getbalances() are allowed to fail if there is no wallet.
        if (!batch[ID_NETWORKINFO]["error"].isNull()) {
            return batch[ID_NETWORKINFO];
        }
        if (!batch[ID_BLOCKCHAININFO]["error"].isNull()) {
            return batch[ID_BLOCKCHAININFO];
        }
        result.pushKV("version", batch[ID_NETWORKINFO]["result"]["version"]);
        result.pushKV("blocks", batch[ID_BLOCKCHAININFO]["result"]["blocks"]);
        result.pushKV("headers", batch[ID_BLOCKCHAININFO]["result"]["headers"]);
        result.pushKV("verificationprogress", batch[ID_BLOCKCHAININFO]["result"]["verificationprogress"]);
        result.pushKV("timeoffset", batch[ID_NETWORKINFO]["result"]["timeoffset"]);

        UniValue connections(UniValue::VOBJ);
        connections.pushKV("in", batch[ID_NETWORKINFO]["result"]["connections_in"]);
        connections.pushKV("out", batch[ID_NETWORKINFO]["result"]["connections_out"]);
        connections.pushKV("total", batch[ID_NETWORKINFO]["result"]["connections"]);
        result.pushKV("connections", std::move(connections));

        result.pushKV("networks", batch[ID_NETWORKINFO]["result"]["networks"]);
        result.pushKV("difficulty", batch[ID_BLOCKCHAININFO]["result"]["difficulty"]);
        result.pushKV("chain", UniValue(batch[ID_BLOCKCHAININFO]["result"]["chain"]));
        if (!batch[ID_WALLETINFO]["result"].isNull()) {
            result.pushKV("has_wallet", true);
            result.pushKV("keypoolsize", batch[ID_WALLETINFO]["result"]["keypoolsize"]);
            result.pushKV("walletname", batch[ID_WALLETINFO]["result"]["walletname"]);
            if (!batch[ID_WALLETINFO]["result"]["unlocked_until"].isNull()) {
                result.pushKV("unlocked_until", batch[ID_WALLETINFO]["result"]["unlocked_until"]);
            }
            result.pushKV("paytxfee", batch[ID_WALLETINFO]["result"]["paytxfee"]);
        }
        if (!batch[ID_BALANCES]["result"].isNull()) {
            result.pushKV("balance", batch[ID_BALANCES]["result"]["mine"]["trusted"]);
        }
        result.pushKV("relayfee", batch[ID_NETWORKINFO]["result"]["relayfee"]);
        result.pushKV("warnings", batch[ID_NETWORKINFO]["result"]["warnings"]);
        return JSONRPCReplyObj(std::move(result), NullUniValue,  /*id=*/1, JSONRPCVersion::V2);
    }